

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O1

CVmHashEntry * __thiscall CVmHashTable::find_leading_substr(CVmHashTable *this,char *str,size_t len)

{
  CVmHashEntry *pCVar1;
  
  if (len != 0) {
    do {
      pCVar1 = find(this,str,len);
      if (pCVar1 != (CVmHashEntry *)0x0) {
        return pCVar1;
      }
      len = len - 1;
    } while (len != 0);
  }
  return (CVmHashEntry *)0x0;
}

Assistant:

CVmHashEntry *CVmHashTable::find_leading_substr(const char *str, size_t len)
{
    size_t sublen;
    CVmHashEntry *entry;

    /* 
     *   try to find each leading substring, starting with the longest,
     *   decreasing by one character on each iteration, until we've used
     *   the whole string 
     */
    for (sublen = len ; sublen > 0 ; --sublen)
    {
        /* if this substring matches, use it */
        if ((entry = find(str, sublen)) != 0)
            return entry;
    }

    /* we didn't find it */
    return 0;
}